

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetActiveIdUsingNavAndKeys(void)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->ActiveId != 0) {
    (GImGui->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
    (pIVar1->ActiveIdUsingKeyInputMask).Storage[2] = 0xffffffff;
    (pIVar1->ActiveIdUsingKeyInputMask).Storage[3] = 0xffffffff;
    (pIVar1->ActiveIdUsingKeyInputMask).Storage[4] = 0xffffffff;
    pIVar1->ActiveIdUsingNavDirMask = 0xffffffff;
    pIVar1->ActiveIdUsingNavInputMask = 0xffffffff;
    (pIVar1->ActiveIdUsingKeyInputMask).Storage[0] = 0xffffffff;
    (pIVar1->ActiveIdUsingKeyInputMask).Storage[1] = 0xffffffff;
    NavMoveRequestCancel();
    return;
  }
  __assert_fail("g.ActiveId != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x13f9,"void ImGui::SetActiveIdUsingNavAndKeys()");
}

Assistant:

void ImGui::SetActiveIdUsingNavAndKeys()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId != 0);
    g.ActiveIdUsingNavDirMask = ~(ImU32)0;
    g.ActiveIdUsingNavInputMask = ~(ImU32)0;
    g.ActiveIdUsingKeyInputMask.SetAllBits();
    NavMoveRequestCancel();
}